

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astar_pidd.hpp
# Opt level: O2

vector<Tiles::State,_std::allocator<Tiles::State>_> * __thiscall
astar_pidd::AStarPIDD<Tiles>::search
          (vector<Tiles::State,_std::allocator<Tiles::State>_> *__return_storage_ptr__,
          AStarPIDD<Tiles> *this,State *init)

{
  CompressClosedListAsync<Node<Tiles>_> *this_00;
  size_t *psVar1;
  CompressOpenList<Node<Tiles>_> *this_01;
  vector<Tiles::State,_std::allocator<Tiles::State>_> *__x;
  pointer pNVar2;
  int newb;
  Tiles *this_02;
  char cVar3;
  ulong uVar4;
  ostream *poVar5;
  long lVar6;
  long lVar7;
  size_t i;
  ulong uVar8;
  State state;
  value_type n;
  Node<Tiles> parent;
  char local_88;
  int local_84;
  vector<Node<Tiles>,_std::allocator<Node<Tiles>_>_> nodes;
  vector<Node<Tiles>,_std::allocator<Node<Tiles>_>_> reopened_nodes;
  State parent_state;
  
  this_01 = &this->open;
  wrap(&parent,this,init,(Node<Tiles> *)0x0,0,-1);
  compress::CompressOpenList<Node<Tiles>_>::push(this_01,&parent);
  __x = &this->path;
  this_00 = &this->closed;
  do {
    if (((this->open).size == 0) ||
       ((this->path).super__Vector_base<Tiles::State,_std::allocator<Tiles::State>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (this->path).super__Vector_base<Tiles::State,_std::allocator<Tiles::State>_>._M_impl.
        super__Vector_impl_data._M_start)) {
      std::vector<Tiles::State,_std::allocator<Tiles::State>_>::vector(__return_storage_ptr__,__x);
      return __return_storage_ptr__;
    }
    reopened_nodes.super__Vector_base<Node<Tiles>,_std::allocator<Node<Tiles>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    reopened_nodes.super__Vector_base<Node<Tiles>,_std::allocator<Node<Tiles>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    reopened_nodes.super__Vector_base<Node<Tiles>,_std::allocator<Node<Tiles>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    collect_unique_nodes(&nodes,this,0x20);
    compress::CompressClosedListAsync<Node<Tiles>_>::batch_duplicate_detection(this_00,&nodes);
    uVar8 = 0;
    while (uVar8 < (ulong)(((long)nodes.
                                  super__Vector_base<Node<Tiles>,_std::allocator<Node<Tiles>_>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)nodes.
                                 super__Vector_base<Node<Tiles>,_std::allocator<Node<Tiles>_>_>.
                                 _M_impl.super__Vector_impl_data._M_start) / 0x18)) {
      n.packed.word =
           nodes.super__Vector_base<Node<Tiles>,_std::allocator<Node<Tiles>_>_>._M_impl.
           super__Vector_impl_data._M_start[uVar8].packed.word;
      pNVar2 = nodes.super__Vector_base<Node<Tiles>,_std::allocator<Node<Tiles>_>_>._M_impl.
               super__Vector_impl_data._M_start + uVar8;
      n.f = pNVar2->f;
      n.g = pNVar2->g;
      n.pop = pNVar2->pop;
      n._3_5_ = *(undefined5 *)&pNVar2->field_0x3;
      n.parent_packed.word = (pNVar2->parent_packed).word;
      Tiles::unpack((this->super_SearchAlg<Tiles>).dom,&state,n.packed);
      cVar3 = state.h;
      if (state.h == '\0') {
        std::vector<Tiles::State,_std::allocator<Tiles::State>_>::push_back(__x,&state);
        while (n.packed.word != n.parent_packed.word) {
          compress::CompressClosedListAsync<Node<Tiles>_>::trace_parent(&parent,this_00,&n);
          Tiles::unpack((this->super_SearchAlg<Tiles>).dom,&parent_state,parent.packed);
          std::vector<Tiles::State,_std::allocator<Tiles::State>_>::push_back
                    (__x,(value_type *)&parent_state);
          n._4_4_ = parent._4_4_;
          n.f = parent.f;
          n.g = parent.g;
          n.pop = parent.pop;
          n._3_1_ = parent._3_1_;
          n.parent_packed.word =
               CONCAT44(parent.parent_packed.word._4_4_,(int)parent.parent_packed.word);
          n.packed = (PackedState)parent.packed.word;
        }
        compress::CompressClosedListAsync<Node<Tiles>_>::print_statistics(this_00);
        compress::CompressOpenList<Node<Tiles>_>::clear(this_01);
        compress::CompressClosedListAsync<Node<Tiles>_>::clear(this_00);
        poVar5 = std::operator<<((ostream *)&std::cout,"duplicates ");
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
        std::endl<char,std::char_traits<char>>(poVar5);
        std::vector<Tiles::State,_std::allocator<Tiles::State>_>::vector(__return_storage_ptr__,__x)
        ;
      }
      else {
        psVar1 = &(this->super_SearchAlg<Tiles>).expd;
        *psVar1 = *psVar1 + 1;
        uVar4 = (ulong)(byte)state.blank;
        lVar7 = 0;
        while( true ) {
          this_02 = (this->super_SearchAlg<Tiles>).dom;
          lVar6 = (long)(char)uVar4 * 0x14;
          if (*(int *)(this_02 + lVar6 + 0x4440) <= lVar7) break;
          newb = *(int *)(this_02 + lVar7 * 4 + lVar6 + 0x4444);
          if (newb != n.pop) {
            psVar1 = &(this->super_SearchAlg<Tiles>).gend;
            *psVar1 = *psVar1 + 1;
            Tiles::apply((Edge<Tiles> *)&parent,this_02,&state,newb);
            wrap((Node<Tiles> *)&parent_state,this,&state,&n,(int)parent.parent_packed.word,
                 parent._4_4_);
            compress::CompressOpenList<Node<Tiles>_>::push(this_01,(Node<Tiles> *)&parent_state);
            state.h = local_88;
            uVar4 = (ulong)local_84;
            state.tiles[state.blank] = state.tiles[uVar4];
            state.blank = (char)local_84;
          }
          lVar7 = lVar7 + 1;
        }
      }
      uVar8 = uVar8 + 1;
      if (cVar3 == '\0') {
        std::_Vector_base<Node<Tiles>,_std::allocator<Node<Tiles>_>_>::~_Vector_base
                  (&nodes.super__Vector_base<Node<Tiles>,_std::allocator<Node<Tiles>_>_>);
        std::_Vector_base<Node<Tiles>,_std::allocator<Node<Tiles>_>_>::~_Vector_base
                  (&reopened_nodes.super__Vector_base<Node<Tiles>,_std::allocator<Node<Tiles>_>_>);
        return __return_storage_ptr__;
      }
    }
    std::_Vector_base<Node<Tiles>,_std::allocator<Node<Tiles>_>_>::~_Vector_base
              (&nodes.super__Vector_base<Node<Tiles>,_std::allocator<Node<Tiles>_>_>);
    std::_Vector_base<Node<Tiles>,_std::allocator<Node<Tiles>_>_>::~_Vector_base
              (&reopened_nodes.super__Vector_base<Node<Tiles>,_std::allocator<Node<Tiles>_>_>);
  } while( true );
}

Assistant:

std::vector<typename Domain::State>
        search(typename Domain::State &init) {
            open.push(wrap(init, nullptr, 0, -1));

            while (!open.isempty() && path.size() == 0) {
                // temporary placeholder for intermediate reopenings
                std::vector<Node<Domain> > reopened_nodes;

                auto nodes = collect_unique_nodes(N_THREADS);
                
                closed.batch_duplicate_detection(nodes);
                               
                for (std::size_t i = 0; i < nodes.size(); ++i) {
                    auto n = nodes[i];
                    
                    typename Domain::State state;
                    this->dom.unpack(state, n.packed);

                    if (this->dom.isgoal(state)) {
                        // trace path here
                        path.push_back(state);
                        while(n.packed != n.parent_packed) {
                            Node<Domain> parent = closed.trace_parent(n);
                            typename Domain::State parent_state;
                            this->dom.unpack(parent_state, parent.packed);
                            path.push_back(parent_state);
                            n = parent;
                        }
                        closed.print_statistics();
                        open.clear();
                        closed.clear();
                        std::cout << "duplicates " << duplicates << std::endl;
                        return path;
                    }

                    this->expd++;
                    for (int i = 0; i < this->dom.nops(state); i++) {
                        int op = this->dom.nthop(state, i);
                        if (op == n.pop)
                            continue;
                        this->gend++;
                        Edge<Domain> e = this->dom.apply(state, op);
                        open.push(wrap(state, &n, e.cost, e.pop));
                        this->dom.undo(state, e);
                    }
                }
            }
            return path;
        }